

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelets.cpp
# Opt level: O1

void lts2::CreateWaveletDisplay(Mat *waves,Mat *display,int ww,int wh)

{
  long lVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  _InputArray *p_Var5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  double wmax;
  double wmin;
  Mat C;
  Mat VV;
  Mat HV;
  Mat HH;
  Mat submat;
  ulong local_280;
  double local_278;
  double local_270;
  Mat *local_268;
  ulong local_260;
  uint local_258;
  uint local_254;
  _InputArray local_250;
  long local_238;
  Range local_230;
  Range local_228;
  _InputArray local_220 [3];
  long *local_1d8;
  _InputArray local_1c0 [4];
  _InputArray local_160 [4];
  ulong local_100;
  _InputArray local_f8 [4];
  _InputArray local_98;
  undefined8 uStack_80;
  
  local_100 = **(ulong **)(waves + 0x40) << 0x20 | **(ulong **)(waves + 0x40) >> 0x20;
  cv::Mat::create(display,&local_100,0);
  local_220[0].obj = &local_98;
  local_98.sz.width = 0;
  local_98.sz.height = 0;
  uStack_80 = 0;
  local_98.flags = 0;
  local_98._4_4_ = 0;
  local_98.obj = (void *)0x0;
  local_220[0].flags = -0x3efdfffa;
  local_220[0].sz = (Size)&DAT_400000001;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)display,local_220);
  uVar13 = ww / 2;
  uVar6 = (ulong)uVar13;
  uVar9 = (ulong)(uint)(wh / 2);
  cv::Mat::Mat((Mat *)&local_98);
  cv::Mat::Mat((Mat *)local_220);
  local_1c0[0]._0_8_ = uVar9 << 0x20;
  local_160[0]._0_8_ = uVar6 << 0x20;
  local_268 = waves;
  cv::Mat::Mat((Mat *)local_f8,waves,(Range *)local_1c0,(Range *)local_160);
  cv::Mat::operator=((Mat *)&local_98,(Mat *)local_f8);
  cv::Mat::~Mat((Mat *)local_f8);
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x1010000;
  local_f8[0].obj = &local_98;
  p_Var5 = (_InputArray *)cv::noArray();
  cv::minMaxLoc(local_f8,&local_270,&local_278,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
  local_f8[0].sz.width = 0;
  local_f8[0].sz.height = 0;
  local_f8[0].flags = 0x2010000;
  local_f8[0].obj = local_220;
  cv::Mat::convertTo((_OutputArray *)&local_98,(int)local_f8,255.0 / (local_278 - local_270),
                     (local_270 * -255.0) / (local_278 - local_270));
  if (1 < wh) {
    uVar8 = 0;
    do {
      if (1 < ww) {
        lVar7 = *local_1d8;
        lVar1 = **(long **)(display + 0x48);
        lVar2 = *(long *)(display + 0x10);
        lVar11 = 0;
        do {
          *(undefined1 *)(lVar1 * uVar8 + lVar2 + lVar11) =
               ((undefined1 *)(lVar7 * uVar8 + (long)local_220[0].sz))[lVar11];
          lVar11 = lVar11 + 1;
        } while (uVar13 != (uint)lVar11);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != uVar9);
  }
  uVar12 = *(uint *)(local_268 + 0xc);
  uVar8 = uVar6;
  local_280 = uVar9;
  if ((int)uVar13 <= (int)uVar12 / 2) {
    do {
      uVar13 = *(uint *)(local_268 + 8);
      if ((int)uVar13 / 2 < (int)uVar9) break;
      iVar3 = (int)uVar6;
      local_254 = (int)uVar8 + iVar3;
      if ((int)local_254 <= (int)uVar12) {
        uVar12 = local_254;
      }
      iVar4 = (int)local_280;
      local_258 = iVar4 + (int)uVar9;
      if ((int)local_258 <= (int)uVar13) {
        uVar13 = local_258;
      }
      local_1c0[0]._0_8_ = (ulong)uVar13 << 0x20;
      local_230 = (Range)(uVar8 | (ulong)uVar12 << 0x20);
      local_260 = uVar9;
      local_160[0]._0_8_ = local_230;
      cv::Mat::Mat((Mat *)local_f8,local_268,(Range *)local_1c0,(Range *)local_160);
      local_1c0[0].sz.width = 0;
      local_1c0[0].sz.height = 0;
      local_1c0[0].flags = 0x1010000;
      local_1c0[0].obj = local_f8;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(local_1c0,&local_270,&local_278,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_1c0[0].sz.width = 0;
      local_1c0[0].sz.height = 0;
      local_1c0[0].flags = 0x2010000;
      local_1c0[0].obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_f8,(int)local_1c0,255.0 / (local_278 - local_270),
                         (local_270 * -255.0) / (local_278 - local_270));
      local_238 = (long)(int)uVar8;
      uVar9 = local_260 & 0xffffffff;
      if (0 < (int)local_260) {
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar7 = *local_1d8;
            lVar1 = *(long *)(display + 0x10);
            lVar2 = **(long **)(display + 0x48);
            lVar11 = 0;
            do {
              *(undefined1 *)(lVar2 * uVar6 + lVar1 + local_238 + lVar11) =
                   ((undefined1 *)(lVar7 * uVar6 + (long)local_220[0].sz))[lVar11];
              lVar11 = lVar11 + 1;
            } while (iVar3 != (int)lVar11);
          }
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar9);
      }
      local_250._0_8_ = (ulong)uVar12 << 0x20;
      local_160[0].flags = iVar4;
      local_160[0]._4_4_ = uVar13;
      cv::Mat::Mat((Mat *)local_1c0,local_268,(Range *)local_160,(Range *)&local_250);
      local_160[0].sz.width = 0;
      local_160[0].sz.height = 0;
      local_160[0].flags = 0x1010000;
      local_160[0].obj = local_1c0;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(local_160,&local_270,&local_278,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_160[0].sz.width = 0;
      local_160[0].sz.height = 0;
      local_160[0].flags = 0x2010000;
      local_160[0].obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_1c0,(int)local_160,255.0 / (local_278 - local_270),
                         (local_270 * -255.0) / (local_278 - local_270));
      if (0 < (int)local_260) {
        lVar7 = (long)iVar4;
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar1 = *local_1d8;
            lVar2 = **(long **)(display + 0x48);
            lVar11 = *(long *)(display + 0x10);
            lVar10 = 0;
            do {
              *(undefined1 *)(lVar2 * lVar7 + lVar11 + lVar10) =
                   ((undefined1 *)(lVar1 * uVar6 + (long)local_220[0].sz))[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar3 != (int)lVar10);
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 1;
        } while (uVar6 != uVar9);
      }
      local_228 = local_230;
      local_250.flags = iVar4;
      local_250._4_4_ = uVar13;
      cv::Mat::Mat((Mat *)local_160,local_268,(Range *)&local_250,&local_228);
      local_250.sz.width = 0;
      local_250.sz.height = 0;
      local_250.flags = 0x1010000;
      local_250.obj = local_160;
      p_Var5 = (_InputArray *)cv::noArray();
      cv::minMaxLoc(&local_250,&local_270,&local_278,(Point_ *)0x0,(Point_ *)0x0,p_Var5);
      local_250.sz.width = 0;
      local_250.sz.height = 0;
      local_250.flags = 0x2010000;
      local_250.obj = local_220;
      cv::Mat::convertTo((_OutputArray *)local_160,(int)&local_250,255.0 / (local_278 - local_270),
                         (local_270 * -255.0) / (local_278 - local_270));
      if (0 < (int)local_260) {
        lVar7 = (long)iVar4;
        uVar6 = 0;
        do {
          if (0 < iVar3) {
            lVar1 = *local_1d8;
            lVar2 = *(long *)(display + 0x10);
            lVar11 = **(long **)(display + 0x48);
            lVar10 = 0;
            do {
              *(undefined1 *)(lVar11 * lVar7 + lVar2 + local_238 + lVar10) =
                   ((undefined1 *)(lVar1 * uVar6 + (long)local_220[0].sz))[lVar10];
              lVar10 = lVar10 + 1;
            } while (iVar3 != (int)lVar10);
          }
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + 1;
        } while (uVar6 != uVar9);
      }
      uVar6 = (ulong)(uint)(iVar3 * 2);
      uVar9 = (ulong)(uint)((int)local_260 * 2);
      cv::Mat::~Mat((Mat *)local_160);
      cv::Mat::~Mat((Mat *)local_1c0);
      cv::Mat::~Mat((Mat *)local_f8);
      uVar12 = *(uint *)(local_268 + 0xc);
      uVar8 = (ulong)local_254;
      local_280 = (ulong)local_258;
    } while (iVar3 * 2 <= (int)uVar12 / 2);
  }
  cv::Mat::~Mat((Mat *)local_220);
  cv::Mat::~Mat((Mat *)&local_98);
  return;
}

Assistant:

void lts2::CreateWaveletDisplay(const cv::Mat &waves, cv::Mat &display, int ww, int wh)
{
  display.create(waves.size(), CV_8U);
  display.setTo(cv::Scalar(0));
    
  // Find the continuous part first
  int subWindowWidth = ww / 2;
  int subWindowHeight = wh / 2;

  cv::Mat submat;
    
  cv::Mat C;
  submat = waves(cv::Range(0, subWindowHeight), cv::Range(0, subWindowWidth));
    
  double wmin, wmax, wrange;
  cv::minMaxLoc(submat, &wmin, &wmax);
  wrange = wmax - wmin;
    
  submat.convertTo(C, CV_8UC1, 255.0/wrange, -255.0f*wmin/wrange);
    
  for (int y = 0; y < subWindowHeight; ++y)
  {
    const uchar* srcptr = C.ptr<uchar>(y);
    uchar* destptr = display.ptr<uchar>(y);
        
    for (int x = 0; x < subWindowWidth; ++x)
      *destptr++ = *srcptr++;
  }
    
  // Now for the diff images
  int offsetX = subWindowWidth;
  int offsetY = subWindowHeight;
    
  while (subWindowWidth <= waves.cols/2 && subWindowHeight <= waves.rows/2) 
  {
    int maxX = MIN(waves.cols, offsetX + subWindowWidth);
    int maxY = MIN(waves.rows, offsetY + subWindowHeight);
        
    // HH
    cv::Mat HH = waves(cv::Range(0, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HH, &wmin, &wmax);
    wrange = wmax - wmin;
    HH.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }

    // VV
    cv::Mat VV = waves(cv::Range(offsetY, maxY), cv::Range(0, maxX));
    cv::minMaxLoc(VV, &wmin, &wmax);
    wrange = wmax - wmin;
    VV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY);
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // HV
    cv::Mat HV = waves(cv::Range(offsetY, maxY), cv::Range(offsetX, maxX));
    cv::minMaxLoc(HV, &wmin, &wmax);
    wrange = wmax - wmin;
    HV.convertTo(C, CV_8UC1, 255.0/wrange, -255.0*wmin/(wmax-wmin));
        
    for (int y = 0; y < subWindowHeight; ++y)
    {
      const uchar* srcptr = C.ptr<uchar>(y);
      uchar* destptr = display.ptr<uchar>(y+offsetY) + offsetX;
            
      for (int x = 0; x < subWindowWidth; ++x)
        *destptr++ = *srcptr++;
    }
        
    // Update the bounds
    offsetX += subWindowWidth;
    offsetY += subWindowHeight;
    subWindowWidth *= 2;
    subWindowHeight *= 2;
  }
}